

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adhuff_common.c
# Opt level: O1

void swap_nodes(adh_node_t *node1,adh_node_t *node2)

{
  adh_order_t aVar1;
  adh_node_t *paVar2;
  adh_node *paVar3;
  adh_node_t *paVar4;
  
  paVar2 = node1->parent;
  if ((paVar2 != node2) && (paVar3 = node2->parent, paVar3 != node1)) {
    paVar4 = paVar3->left;
    *(adh_node_t **)((paVar2->bit_array).buffer + (ulong)(paVar2->left != node1) * 8 + -0x1a) =
         node2;
    *(adh_node_t **)((paVar3->bit_array).buffer + (ulong)(paVar4 != node2) * 8 + -0x1a) = node1;
    node1->parent = paVar3;
    node2->parent = paVar2;
    aVar1 = node1->order;
    node1->order = node2->order;
    node2->order = aVar1;
    update_node_encoding(node1);
    update_node_encoding(node2);
    return;
  }
  return;
}

Assistant:

void swap_nodes(adh_node_t *node1, adh_node_t *node2){
    if (node1->parent == node2 || node2->parent == node1) {
        //log_info("swap_nodes", " TRYING TO SWAP NODE WITH ITS PARENT\n");
        return;
    }

#ifdef _DEBUG
    char str1[MAX_SYMBOL_STR];
    strcpy (str1,fmt_node(node1));

    log_debug("    swap_nodes", "%s <-> %s\n", str1, fmt_node(node2));
#endif

    bool is_node1_left = node1->parent->left == node1;
    bool is_node2_left = node2->parent->left == node2;

    // check if node1 is left or right child
    if (is_node1_left){
        //node1 is left child
        node1->parent->left = node2;
    } else {
        //node1 is right child
        node1->parent->right = node2;
    }

    // check if node2 is left or right child
    if (is_node2_left){
        //node2 is left child
        node2->parent->left = node1;
    } else {
        //node2 is right child
        node2->parent->right = node1;
    }

    // fix their fathers
    adh_node_t *temp_node = node1->parent;
    node1->parent = node2->parent;
    node2->parent = temp_node;

    // revert original order, since doesn't need to be swapped
    adh_order_t temp_order = node1->order;
    node1->order = node2->order;
    node2->order = temp_order;

    update_node_encoding(node1);  // update bit_array
    update_node_encoding(node2);  // update bit_array
}